

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O3

void sys_expandpath(char *from,char *to,int bufsize)

{
  size_t sVar1;
  char *__src;
  char *pcVar2;
  
  sVar1 = strlen(from);
  if (sVar1 == 1) {
    if (*from == '~') {
LAB_0017704a:
      __src = getenv("HOME");
      pcVar2 = to;
      if (__src != (char *)0x0) {
        strncpy(to,__src,1000);
        pcVar2 = to + 999;
        to[999] = '\0';
        sVar1 = strlen(to);
        strncpy(to + sVar1,from + 1,1000 - sVar1);
      }
      goto LAB_001770ba;
    }
  }
  else if ((*from == '~') && (from[1] == '/')) goto LAB_0017704a;
  strncpy(to,from,1000);
  pcVar2 = to + 999;
LAB_001770ba:
  *pcVar2 = '\0';
  return;
}

Assistant:

static void sys_expandpath(const char *from, char *to, int bufsize)
{
    if ((strlen(from) == 1 && from[0] == '~') || (strncmp(from,"~/", 2) == 0))
    {
#ifdef _WIN32
        const char *home = getenv("USERPROFILE");
#else
        const char *home = getenv("HOME");
#endif
        if (home)
        {
            strncpy(to, home, bufsize);
            to[bufsize-1] = 0;
            strncpy(to + strlen(to), from + 1, bufsize - strlen(to));
            to[bufsize-1] = 0;
        }
        else *to = 0;
    }
    else
    {
        strncpy(to, from, bufsize);
        to[bufsize-1] = 0;
    }
#ifdef _WIN32
    {
        char *buf = alloca(bufsize);
        ExpandEnvironmentStrings(to, buf, bufsize-1);
        buf[bufsize-1] = 0;
        strncpy(to, buf, bufsize);
        to[bufsize-1] = 0;
    }
#endif
}